

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O1

void __thiscall HighsSimplexAnalysis::reportFactorTimer(HighsSimplexAnalysis *this)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  HighsTimer *pHVar4;
  pointer pHVar5;
  pointer piVar6;
  pointer pdVar7;
  long *plVar8;
  long lVar9;
  ulong uVar10;
  HighsInt clock_id;
  ulong uVar11;
  long lVar12;
  FactorTimer factor_timer;
  HighsTimerClock all_factor_clocks;
  FactorTimer local_59;
  ulong local_58;
  HighsTimerClock local_50;
  
  HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
  plVar8 = (long *)__tls_get_addr(&PTR_00449ef0);
  iVar2 = *(int *)(*plVar8 + 0x28);
  local_58 = (ulong)iVar2;
  if (0 < (long)local_58) {
    lVar9 = local_58 << 5;
    lVar12 = 0;
    uVar11 = 0;
    do {
      printf("reportFactorTimer: HFactor clocks for thread %d / %d\n",uVar11,(ulong)(iVar2 - 1));
      FactorTimer::reportFactorClock
                (&local_59,
                 (HighsTimerClock *)
                 ((long)&((this->thread_factor_clocks).
                          super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>.
                          _M_impl.super__Vector_impl_data._M_start)->timer_pointer_ + lVar12));
      uVar11 = (ulong)((int)uVar11 + 1);
      lVar12 = lVar12 + 0x20;
    } while (lVar9 != lVar12);
  }
  uVar11 = local_58;
  if (1 < (int)local_58) {
    pHVar4 = ((this->thread_factor_clocks).
              super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
              super__Vector_impl_data._M_start)->timer_pointer_;
    local_50.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_50.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_50.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_50.timer_pointer_ = pHVar4;
    FactorTimer::initialiseFactorClocks(&local_59,&local_50);
    pHVar5 = (this->thread_factor_clocks).
             super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (pHVar4->clock_num_call).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (pHVar4->clock_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = 0;
    do {
      lVar9 = *(long *)&pHVar5[uVar10].clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl;
      lVar12 = 0;
      do {
        iVar2 = local_50.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar12];
        iVar3 = *(int *)(lVar9 + lVar12 * 4);
        piVar1 = piVar6 + iVar2;
        *piVar1 = *piVar1 + piVar6[iVar3];
        pdVar7[iVar2] = pdVar7[iVar3] + pdVar7[iVar2];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x27);
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar11);
    printf("reportFactorTimer: HFactor clocks for all %d threads\n",uVar11 & 0xffffffff);
    FactorTimer::reportFactorClock(&local_59,&local_50);
    if (local_50.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::reportFactorTimer() {
  assert(analyse_factor_time);
  FactorTimer factor_timer;
  HighsInt max_threads = highs::parallel::num_threads();
  for (HighsInt i = 0; i < max_threads; i++) {
    //  for (HighsTimerClock clock : thread_factor_clocks) {
    printf("reportFactorTimer: HFactor clocks for thread %" HIGHSINT_FORMAT
           " / %" HIGHSINT_FORMAT "\n",
           i, max_threads - 1);
    factor_timer.reportFactorClock(thread_factor_clocks[i]);
  }
  if (max_threads > 1) {
    HighsTimer* timer_pointer = thread_factor_clocks[0].timer_pointer_;
    HighsTimerClock all_factor_clocks;
    all_factor_clocks.timer_pointer_ = timer_pointer;
    vector<HighsInt>& clock = all_factor_clocks.clock_;
    factor_timer.initialiseFactorClocks(all_factor_clocks);
    for (HighsInt i = 0; i < max_threads; i++) {
      vector<HighsInt>& thread_clock = thread_factor_clocks[i].clock_;
      for (HighsInt clock_id = 0; clock_id < FactorNumClock; clock_id++) {
        HighsInt all_factor_iClock = clock[clock_id];
        HighsInt thread_factor_iClock = thread_clock[clock_id];
        timer_pointer->clock_num_call[all_factor_iClock] +=
            timer_pointer->clock_num_call[thread_factor_iClock];
        timer_pointer->clock_time[all_factor_iClock] +=
            timer_pointer->clock_time[thread_factor_iClock];
      }
    }
    printf("reportFactorTimer: HFactor clocks for all %" HIGHSINT_FORMAT
           " threads\n",
           max_threads);
    factor_timer.reportFactorClock(all_factor_clocks);
  }
}